

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.cpp
# Opt level: O2

string * getEnvironmentVariable(string *__return_storage_ptr__,string *name)

{
  int iVar1;
  char *pcVar2;
  size_type sVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  size_type sVar5;
  
  paVar4 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar4;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar2 = getenv((name->_M_dataplus)._M_p);
  if (pcVar2 == (char *)0x0) {
    sVar5 = 0;
  }
  else {
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
    paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(__return_storage_ptr__->_M_dataplus)._M_p;
    sVar5 = __return_storage_ptr__->_M_string_length;
  }
  for (sVar3 = 0; sVar5 != sVar3; sVar3 = sVar3 + 1) {
    iVar1 = tolower((int)paVar4->_M_local_buf[sVar3]);
    paVar4->_M_local_buf[sVar3] = (char)iVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string getEnvironmentVariable(const std::string& name) {
    std::string result;
    const char* value = std::getenv(name.c_str());
    if (value) {
        result = value;
    }
    std::transform(result.begin(), result.end(), result.begin(), ::tolower);
    return result;
}